

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Promise<void> __thiscall
capnp::LocalCallContext::tailCall(LocalCallContext *this,Own<capnp::RequestHook> *request)

{
  PromiseNode *pPVar1;
  PipelineHook *pPVar2;
  long lVar3;
  undefined8 uVar4;
  Own<capnp::RequestHook> *in_RDX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *extraout_RDX_04;
  PromiseNode *pPVar5;
  Promise<void> PVar6;
  VoidPromiseAndPipeline result;
  VoidPromiseAndPipeline local_58;
  Disposer *local_38;
  PipelineHook *pPStack_30;
  long local_28;
  undefined8 uStack_20;
  undefined8 *local_18;
  
  directTailCall(&local_58,(LocalCallContext *)request,in_RDX);
  pPVar5 = extraout_RDX;
  if (request[9].disposer != (Disposer *)0x0) {
    local_38 = local_58.pipeline.disposer;
    pPStack_30 = local_58.pipeline.ptr;
    local_58.pipeline.ptr = (PipelineHook *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    local_18 = (undefined8 *)0x0;
    (**(request[9].disposer)->_vptr_Disposer)();
    uVar4 = uStack_20;
    lVar3 = local_28;
    pPVar5 = extraout_RDX_00;
    if (local_28 != 0) {
      local_28 = 0;
      uStack_20 = 0;
      (**(code **)*local_18)(local_18,lVar3,8,uVar4,uVar4,0);
      pPVar5 = extraout_RDX_01;
    }
    pPVar2 = pPStack_30;
    if (pPStack_30 != (PipelineHook *)0x0) {
      pPStack_30 = (PipelineHook *)0x0;
      (**local_38->_vptr_Disposer)
                (local_38,pPVar2->_vptr_PipelineHook[-2] + (long)&pPVar2->_vptr_PipelineHook);
      pPVar5 = extraout_RDX_02;
    }
  }
  pPVar2 = local_58.pipeline.ptr;
  (this->super_CallContextHook)._vptr_CallContextHook =
       (_func_int **)local_58.promise.super_PromiseBase.node.disposer;
  (this->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)local_58.promise.super_PromiseBase.node.ptr;
  local_58.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  if (local_58.pipeline.ptr != (PipelineHook *)0x0) {
    local_58.pipeline.ptr = (PipelineHook *)0x0;
    (**(local_58.pipeline.disposer)->_vptr_Disposer)
              (local_58.pipeline.disposer,
               pPVar2->_vptr_PipelineHook[-2] + (long)&pPVar2->_vptr_PipelineHook);
    pPVar5 = extraout_RDX_03;
  }
  pPVar1 = local_58.promise.super_PromiseBase.node.ptr;
  if (local_58.promise.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
    local_58.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_58.promise.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_58.promise.super_PromiseBase.node.disposer,
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pPVar5 = extraout_RDX_04;
  }
  PVar6.super_PromiseBase.node.ptr = pPVar5;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar6.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> tailCall(kj::Own<RequestHook>&& request) override {
    auto result = directTailCall(kj::mv(request));
    KJ_IF_MAYBE(f, tailCallPipelineFulfiller) {
      f->get()->fulfill(AnyPointer::Pipeline(kj::mv(result.pipeline)));
    }
    return kj::mv(result.promise);
  }